

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::AddItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *tgt)

{
  string *config;
  char *__s;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  byte bVar4;
  string linkItem;
  string exe;
  cmGeneratorTarget *local_78;
  bool local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  local_78 = tgt;
  if (tgt == (cmGeneratorTarget *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = cmGeneratorTarget::IsExecutableWithExports(tgt);
  }
  if (((bVar1 != false) && (this->UseImportLibrary == false)) && (this->LoaderFlag == (char *)0x0))
  {
    return;
  }
  if ((local_78 == (cmGeneratorTarget *)0x0) ||
     (bVar2 = cmGeneratorTarget::IsLinkable(local_78), !bVar2)) {
    bVar1 = cmsys::SystemTools::FileIsFullPath(item);
    if (!bVar1) {
      AddUserItem(this,item,true);
      return;
    }
    bVar1 = cmsys::SystemTools::FileIsDirectory(item);
    if (bVar1) {
      AddDirectoryItem(this,item);
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Depends,item);
    AddFullItem(this,item);
    AddLibraryRuntimeInfo(this,item);
    return;
  }
  config = &this->Config;
  if ((bVar1 == false) || (__s = this->LoaderFlag, __s == (char *)0x0)) {
    TVar3 = cmGeneratorTarget::GetType(local_78);
    if (TVar3 != INTERFACE_LIBRARY) {
      TVar3 = cmGeneratorTarget::GetType(local_78);
      if (TVar3 == OBJECT_LIBRARY) {
        return;
      }
      bVar4 = this->UseImportLibrary;
      if (bVar1 == false && (bool)bVar4 == true) {
        TVar3 = cmGeneratorTarget::GetType(local_78);
        bVar4 = TVar3 == SHARED_LIBRARY;
      }
      cmGeneratorTarget::GetFullPath(&local_68,local_78,config,(uint)bVar4,true);
      if ((this->LinkDependsNoShared != true) ||
         (TVar3 = cmGeneratorTarget::GetType(local_78), TVar3 != SHARED_LIBRARY)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Depends,&local_68);
      }
      AddTargetItem(this,&local_68,local_78);
      AddLibraryRuntimeInfo(this,&local_68,local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) {
        return;
      }
      goto LAB_00339d2c;
    }
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p._0_1_ = 0;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string,bool,cmGeneratorTarget_const*&>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&local_68,(bool *)&local_48,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    cmGeneratorTarget::GetImportedLibName(&local_68,local_78,config);
    if (local_68._M_string_length != 0) {
      AddItem(this,&local_68,(cmGeneratorTarget *)0x0);
    }
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,(ulong)__s);
    cmGeneratorTarget::GetFullPath(&local_48,local_78,config,(uint)this->UseImportLibrary,true);
    std::__cxx11::string::_M_append
              ((char *)&local_68,
               CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_));
    local_69 = true;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string&,bool,cmGeneratorTarget_const*&>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&local_68,&local_69,&local_78);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Depends,
               &local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_) !=
        &local_48.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_),
                      local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    return;
  }
LAB_00339d2c:
  operator_delete(local_68._M_dataplus._M_p,
                  CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                           local_68.field_2._M_local_buf[0]) + 1);
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(std::string const& item,
                                       cmGeneratorTarget const* tgt)
{
  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !this->UseImportLibrary && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now.
      std::string linkItem;
      linkItem = this->LoaderFlag;
      cmStateEnums::ArtifactType artifact = this->UseImportLibrary
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      std::string exe = tgt->GetFullPath(config, artifact, true);
      linkItem += exe;
      this->Items.emplace_back(linkItem, true, tgt);
      this->Depends.push_back(std::move(exe));
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.emplace_back(std::string(), false, tgt);

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(libName, nullptr);
      }
    } else if (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      // Ignore object library!
      // Its object-files should already have been extracted for linking.
    } else {
      // Decide whether to use an import library.
      bool implib =
        (this->UseImportLibrary &&
         (impexe || tgt->GetType() == cmStateEnums::SHARED_LIBRARY));
      cmStateEnums::ArtifactType artifact = implib
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      std::string lib = tgt->GetFullPath(config, artifact, true);
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib);
      }

      this->AddTargetItem(lib, tgt);
      this->AddLibraryRuntimeInfo(lib, tgt);
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmSystemTools::FileIsFullPath(item)) {
      if (cmSystemTools::FileIsDirectory(item)) {
        // This is a directory.
        this->AddDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item);
        this->AddFullItem(item);
        this->AddLibraryRuntimeInfo(item);
      }
    } else {
      // This is a library or option specified by the user.
      this->AddUserItem(item, true);
    }
  }
}